

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O1

void __thiscall cppnet::BlockMemoryPool::ReleaseHalf(BlockMemoryPool *this)

{
  pointer __src;
  pointer *pppvVar1;
  pointer __dest;
  pointer ppvVar2;
  void *__ptr;
  ulong uVar3;
  ulong uVar4;
  iterator iter;
  
  __dest = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)__dest >> 3;
  uVar3 = uVar4 >> 1;
  __src = __dest + 1;
  while( true ) {
    uVar4 = uVar4 - 1;
    ppvVar2 = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (__dest == ppvVar2) {
      return;
    }
    __ptr = *__dest;
    if (__src != ppvVar2) {
      memmove(__dest,__src,(long)ppvVar2 - (long)__src);
    }
    pppvVar1 = &(this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + -1;
    free(__ptr);
    if (__dest == (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) break;
    if (uVar4 <= uVar3) {
      return;
    }
  }
  return;
}

Assistant:

void BlockMemoryPool::ReleaseHalf() {
#ifdef __use_iocp__
    std::lock_guard<std::mutex> lock(_mutex);
#endif
    size_t size = _free_mem_vec.size();
    size_t hale = size / 2;
    for (auto iter = _free_mem_vec.begin(); iter != _free_mem_vec.end();) {
        void* mem = *iter;

        iter = _free_mem_vec.erase(iter);
        free(mem);
        
        size--;
        if (iter == _free_mem_vec.end() || size <= hale) {
            break;
        }
    }
}